

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::ToolBarPrivate::init(ToolBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  ToolBar *pTVar1;
  Orientation OVar2;
  int extraout_EAX;
  ToolBarLayout *this_00;
  NavigationArrow *pNVar3;
  QSize local_28;
  QSizePolicy local_20 [4];
  ToolBarPrivate *local_10;
  ToolBarPrivate *this_local;
  
  local_10 = this;
  this_00 = (ToolBarLayout *)operator_new(0x58);
  ToolBarLayout::ToolBarLayout(this_00,&this->q->super_QWidget);
  this->layout = this_00;
  OVar2 = ToolBarLayout::orientation(this->layout);
  if (OVar2 == Horizontal) {
    pNVar3 = (NavigationArrow *)operator_new(0x30);
    NavigationArrow::NavigationArrow(pNVar3,Left,&this->q->super_QWidget);
    this->left = pNVar3;
  }
  else {
    pNVar3 = (NavigationArrow *)operator_new(0x30);
    NavigationArrow::NavigationArrow(pNVar3,Top,&this->q->super_QWidget);
    this->left = pNVar3;
  }
  OVar2 = ToolBarLayout::orientation(this->layout);
  if (OVar2 == Horizontal) {
    pNVar3 = (NavigationArrow *)operator_new(0x30);
    NavigationArrow::NavigationArrow(pNVar3,Right,&this->q->super_QWidget);
    this->right = pNVar3;
  }
  else {
    pNVar3 = (NavigationArrow *)operator_new(0x30);
    NavigationArrow::NavigationArrow(pNVar3,Bottom,&this->q->super_QWidget);
    this->right = pNVar3;
  }
  ToolBarLayout::setLeftArrow(this->layout,this->left);
  ToolBarLayout::setRightArrow(this->layout,this->right);
  pTVar1 = this->q;
  QSizePolicy::QSizePolicy(local_20,Preferred,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy)SUB84(pTVar1,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  pTVar1 = this->q;
  QSize::QSize(&local_28,0x20,0x20);
  ToolBar::setIconSize(pTVar1,&local_28);
  return extraout_EAX;
}

Assistant:

void
ToolBarPrivate::init()
{
	layout = new ToolBarLayout( q );

	if( layout->orientation() == Qt::Horizontal )
		left = new NavigationArrow( NavigationArrow::Left, q );
	else
		left = new NavigationArrow( NavigationArrow::Top, q );

	if( layout->orientation() == Qt::Horizontal )
		right = new NavigationArrow( NavigationArrow::Right, q );
	else
		right = new NavigationArrow( NavigationArrow::Bottom, q );

	layout->setLeftArrow( left );
	layout->setRightArrow( right );

	q->setSizePolicy( QSizePolicy(
		QSizePolicy::Preferred, QSizePolicy::Fixed ) );

	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );
	q->setIconSize( QSize( 32, 32 ) );
}